

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::recompute_freq(Renderer *this,int v)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Voice *pVVar5;
  int iVar6;
  float fVar7;
  
  pVVar5 = this->voice;
  if ((pVVar5[v].sample)->sample_rate != 0) {
    bVar2 = pVVar5[v].channel;
    uVar3 = this->channel[bVar2].pitchbend;
    if (pVVar5[v].vibrato_control_ratio != 0) {
      pVVar5[v].vibrato_sample_increment[0x1c] = 0;
      pVVar5[v].vibrato_sample_increment[0x1d] = 0;
      pVVar5[v].vibrato_sample_increment[0x1e] = 0;
      pVVar5[v].vibrato_sample_increment[0x1f] = 0;
      pVVar5[v].vibrato_sample_increment[0x18] = 0;
      pVVar5[v].vibrato_sample_increment[0x19] = 0;
      pVVar5[v].vibrato_sample_increment[0x1a] = 0;
      pVVar5[v].vibrato_sample_increment[0x1b] = 0;
      pVVar5[v].vibrato_sample_increment[0x14] = 0;
      pVVar5[v].vibrato_sample_increment[0x15] = 0;
      pVVar5[v].vibrato_sample_increment[0x16] = 0;
      pVVar5[v].vibrato_sample_increment[0x17] = 0;
      pVVar5[v].vibrato_sample_increment[0x10] = 0;
      pVVar5[v].vibrato_sample_increment[0x11] = 0;
      pVVar5[v].vibrato_sample_increment[0x12] = 0;
      pVVar5[v].vibrato_sample_increment[0x13] = 0;
      pVVar5[v].vibrato_sample_increment[0xc] = 0;
      pVVar5[v].vibrato_sample_increment[0xd] = 0;
      pVVar5[v].vibrato_sample_increment[0xe] = 0;
      pVVar5[v].vibrato_sample_increment[0xf] = 0;
      pVVar5[v].vibrato_sample_increment[8] = 0;
      pVVar5[v].vibrato_sample_increment[9] = 0;
      pVVar5[v].vibrato_sample_increment[10] = 0;
      pVVar5[v].vibrato_sample_increment[0xb] = 0;
      pVVar5[v].vibrato_sample_increment[4] = 0;
      pVVar5[v].vibrato_sample_increment[5] = 0;
      pVVar5[v].vibrato_sample_increment[6] = 0;
      pVVar5[v].vibrato_sample_increment[7] = 0;
      pVVar5[v].vibrato_sample_increment[0] = 0;
      pVVar5[v].vibrato_sample_increment[1] = 0;
      pVVar5[v].vibrato_sample_increment[2] = 0;
      pVVar5[v].vibrato_sample_increment[3] = 0;
    }
    iVar4 = pVVar5[v].sample_increment;
    if (uVar3 == 0x2000 || 0x3fff < uVar3) {
      pVVar5 = this->voice;
      fVar7 = pVVar5[v].orig_frequency;
      pVVar5[v].frequency = fVar7;
    }
    else {
      fVar7 = this->channel[bVar2].pitchfactor;
      if (fVar7 == 0.0) {
        iVar1 = uVar3 - 0x2000;
        iVar6 = -iVar1;
        if (0 < iVar1) {
          iVar6 = iVar1;
        }
        fVar7 = exp2f((float)(iVar6 * this->channel[bVar2].pitchsens) * 1.01737676e-07);
        this->channel[bVar2].pitchfactor = fVar7;
      }
      pVVar5 = this->voice;
      if (uVar3 < 0x2000) {
        fVar7 = pVVar5[v].orig_frequency / fVar7;
      }
      else {
        fVar7 = pVVar5[v].orig_frequency * fVar7;
      }
      pVVar5[v].frequency = fVar7;
    }
    fVar7 = ((float)(pVVar5[v].sample)->sample_rate * 4096.0 * fVar7) /
            (this->rate * (pVVar5[v].sample)->root_freq);
    if (iVar4 < 0) {
      fVar7 = -fVar7;
    }
    pVVar5[v].sample_increment = (int)fVar7;
  }
  return;
}

Assistant:

void Renderer::recompute_freq(int v)
{
	Channel *ch = &channel[voice[v].channel];
	int 
		sign = (voice[v].sample_increment < 0), /* for bidirectional loops */
		pb = ch->pitchbend;
	double a;

	if (voice[v].sample->sample_rate == 0)
	{
		return;
	}

	if (voice[v].vibrato_control_ratio != 0)
	{
		/* This instrument has vibrato. Invalidate any precomputed
		   sample_increments. */
		memset(voice[v].vibrato_sample_increment, 0, sizeof(voice[v].vibrato_sample_increment));
	}

	if (pb == 0x2000 || pb < 0 || pb > 0x3FFF)
	{
		voice[v].frequency = voice[v].orig_frequency;
	}
	else
	{
		pb -= 0x2000;
		if (ch->pitchfactor == 0)
		{
			/* Damn. Somebody bent the pitch. */
			ch->pitchfactor = float(pow(2.f, ((abs(pb) * ch->pitchsens) / (8191.f * 1200.f))));
		}
		if (pb < 0)
		{
			voice[v].frequency = voice[v].orig_frequency / ch->pitchfactor;
		}
		else
		{
			voice[v].frequency = voice[v].orig_frequency * ch->pitchfactor;
		}
	}

	a = FSCALE(((double)(voice[v].sample->sample_rate) * voice[v].frequency) /
		((double)(voice[v].sample->root_freq) * rate),
		FRACTION_BITS);

	if (sign) 
		a = -a; /* need to preserve the loop direction */

	voice[v].sample_increment = (int)(a);
}